

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileReceiver.cpp
# Opt level: O0

void __thiscall
MyClientConnection::OnData(MyClientConnection *this,uint32_t channel,uint8_t *data,uint32_t bytes)

{
  ulong *puVar1;
  TonkFile pTVar2;
  undefined8 *puVar3;
  ulong *puVar4;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 in_ZMM0 [64];
  undefined1 in_ZMM1 [64];
  uint64_t remoteUsec;
  uint32_t compressedRemoteUsec;
  uint64_t pongUsec;
  uint64_t pingUsec;
  uint8_t ping_message [9];
  uint64_t nowUsec;
  LogStringBuffer buffer;
  LogStringBuffer buffer_1;
  char *in_stack_fffffffffffff1f8;
  LogStringBuffer *in_stack_fffffffffffff200;
  SDKConnection *in_stack_fffffffffffff208;
  void *in_stack_fffffffffffff210;
  TonkFile in_stack_fffffffffffff218;
  Channel *pCVar8;
  LogStringBuffer *in_stack_fffffffffffff238;
  Channel *buffer_00;
  OutputWorker *in_stack_fffffffffffff240;
  float local_d18;
  float local_d14;
  uint64_t local_d10;
  uint32_t local_d04;
  uint64_t local_d00;
  uint64_t local_cf8;
  undefined1 local_ce9;
  uint8_t auStack_ce8 [120];
  undefined4 local_c70;
  double local_c60;
  float local_c54;
  uint64_t local_c50;
  __0 local_c45 [5];
  long local_c40;
  char *local_c28;
  double *local_c20;
  char *local_c18;
  float *local_c10;
  char *local_c08;
  ulong *local_c00;
  char *local_bf8;
  ulong *local_bf0;
  char *local_be8;
  undefined8 *local_be0;
  char *local_bd8;
  Channel *local_bd0;
  char *local_bc8;
  float *local_bc0;
  char *local_bb8;
  float *local_bb0;
  char *local_ba8;
  Channel *local_ba0;
  char *local_b98;
  double *local_b90;
  char *local_b88;
  float *local_b80;
  char *local_b78;
  ulong *local_b70;
  char *local_b68;
  ulong *local_b60;
  char *local_b58;
  undefined8 *local_b50;
  char *local_b48;
  undefined4 local_b3c;
  Channel *local_b38;
  undefined4 local_b2c;
  Channel *local_b28;
  undefined1 local_b10 [16];
  ostream aoStack_b00 [376];
  char *local_988;
  double *local_980;
  char *local_978;
  float *local_970;
  char *local_968;
  ulong *local_960;
  char *local_958;
  ulong *local_950;
  char *local_948;
  undefined8 *local_940;
  char *local_938;
  undefined4 local_92c;
  Channel *local_928;
  char *local_920;
  double *local_918;
  char *local_910;
  float *local_908;
  char *local_900;
  ulong *local_8f8;
  char *local_8f0;
  ulong *local_8e8;
  char *local_8e0;
  undefined8 *local_8d8;
  char *local_8d0;
  undefined8 local_8c8;
  undefined1 *local_8c0;
  Channel *local_8b8;
  undefined8 local_8b0;
  undefined1 *local_8a8;
  Channel *local_8a0;
  undefined8 local_898;
  undefined1 *local_890;
  char *local_888;
  double *local_880;
  char *local_878;
  float *local_870;
  char *local_868;
  ulong *local_860;
  char *local_858;
  ulong *local_850;
  char *local_848;
  undefined8 *local_840;
  char *local_838;
  undefined1 *local_830;
  Channel *local_828;
  char *local_820;
  undefined1 *local_818;
  Channel *local_810;
  char *local_808;
  double *local_800;
  char *local_7f8;
  float *local_7f0;
  char *local_7e8;
  ulong *local_7e0;
  char *local_7d8;
  ulong *local_7d0;
  char *local_7c8;
  undefined8 *local_7c0;
  undefined1 *local_7b8;
  Channel *local_7b0;
  char *local_7a8;
  undefined1 *local_7a0;
  undefined8 *local_798;
  undefined1 *local_790;
  Channel *local_788;
  char *local_780;
  double *local_778;
  char *local_770;
  float *local_768;
  char *local_760;
  ulong *local_758;
  char *local_750;
  ulong *local_748;
  char *local_740;
  undefined1 *local_738;
  Channel *local_730;
  undefined8 *local_728;
  undefined1 *local_720;
  char *local_718;
  undefined1 *local_710;
  Channel *local_708;
  char *local_700;
  double *local_6f8;
  char *local_6f0;
  float *local_6e8;
  char *local_6e0;
  ulong *local_6d8;
  char *local_6d0;
  ulong *local_6c8;
  undefined1 *local_6c0;
  Channel *local_6b8;
  char *local_6b0;
  undefined1 *local_6a8;
  ulong *local_6a0;
  undefined1 *local_698;
  Channel *local_690;
  char *local_688;
  double *local_680;
  char *local_678;
  float *local_670;
  char *local_668;
  ulong *local_660;
  char *local_658;
  undefined1 *local_650;
  Channel *local_648;
  char *local_640;
  undefined1 *local_638;
  Channel *local_630;
  char *local_628;
  undefined1 *local_620;
  ulong *local_618;
  undefined1 *local_610;
  char *local_608;
  double *local_600;
  char *local_5f8;
  float *local_5f0;
  char *local_5e8;
  ulong *local_5e0;
  undefined1 *local_5d8;
  Channel *local_5d0;
  ulong *local_5c8;
  undefined1 *local_5c0;
  Channel *local_5b8;
  ulong *local_5b0;
  undefined1 *local_5a8;
  char *local_5a0;
  double *local_598;
  char *local_590;
  float *local_588;
  char *local_580;
  undefined1 *local_578;
  Channel *local_570;
  char *local_568;
  undefined1 *local_560;
  Channel *local_558;
  char *local_550;
  double *local_548;
  char *local_540;
  float *local_538;
  undefined1 *local_530;
  Channel *local_528;
  char *local_520;
  undefined1 *local_518;
  float *local_510;
  undefined1 *local_508;
  Channel *local_500;
  char *local_4f8;
  double *local_4f0;
  char *local_4e8;
  undefined1 *local_4e0;
  Channel *local_4d8;
  float *local_4d0;
  undefined1 *local_4c8;
  char *local_4c0;
  undefined1 *local_4b8;
  Channel *local_4b0;
  char *local_4a8;
  double *local_4a0;
  undefined1 *local_498;
  Channel *local_490;
  char *local_488;
  undefined1 *local_480;
  Channel *local_478;
  char *local_470;
  undefined1 *local_468;
  char *local_460;
  undefined1 *local_458;
  double *local_450;
  undefined1 *local_448;
  Channel *local_440;
  double *local_438;
  undefined1 *local_430;
  char *local_428;
  float *local_420;
  char *local_418;
  float *local_410;
  char *local_408;
  undefined4 local_3fc;
  Channel *local_3f8;
  undefined4 local_3ec;
  Channel *local_3e8;
  undefined1 local_3d0 [16];
  ostream aoStack_3c0 [376];
  char *local_248;
  float *local_240;
  char *local_238;
  float *local_230;
  char *local_228;
  undefined4 local_21c;
  Channel *local_218;
  char *local_210;
  float *local_208;
  char *local_200;
  float *local_1f8;
  char *local_1f0;
  undefined8 local_1e8;
  undefined1 *local_1e0;
  Channel *local_1d8;
  undefined8 local_1d0;
  undefined1 *local_1c8;
  Channel *local_1c0;
  undefined8 local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  float *local_1a0;
  char *local_198;
  float *local_190;
  char *local_188;
  undefined1 *local_180;
  Channel *local_178;
  char *local_170;
  undefined1 *local_168;
  Channel *local_160;
  char *local_158;
  float *local_150;
  char *local_148;
  float *local_140;
  undefined1 *local_138;
  Channel *local_130;
  float *local_128;
  undefined1 *local_120;
  Channel *local_118;
  float *local_110;
  undefined1 *local_108;
  char *local_100;
  undefined1 *local_f8;
  char *local_f0;
  float *local_e8;
  char *local_e0;
  undefined1 *local_d8;
  Channel *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  Channel *local_b8;
  char *local_b0;
  float *local_a8;
  undefined1 *local_a0;
  Channel *local_98;
  char *local_90;
  undefined1 *local_88;
  Channel *local_80;
  char *local_78;
  undefined1 *local_70;
  float *local_68;
  undefined1 *local_60;
  Channel *local_58;
  float *local_50;
  undefined1 *local_48;
  char *local_40;
  undefined1 *local_38;
  
  auVar5 = in_ZMM0._0_16_;
  auVar7 = in_ZMM1._0_16_;
  if (in_ESI == 0x96) {
    OnData(unsigned_int,unsigned_char_const*,unsigned_int)::$_0::operator_cast_to_function_pointer
              (local_c45);
    pTVar2 = tonk_file_receive(in_stack_fffffffffffff218,in_stack_fffffffffffff210,
                               (uint32_t)((ulong)in_stack_fffffffffffff208 >> 0x20),
                               (FpTonkFileDone)in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
    *(TonkFile *)(in_RDI + 0x38) = pTVar2;
    local_c50 = tonk_time();
    if ((*(long *)(in_RDI + 0x38) != 0) && (1000000 < local_c50 - *(long *)(in_RDI + 0x40))) {
      *(uint64_t *)(in_RDI + 0x40) = local_c50;
      puVar3 = (undefined8 *)(*(long *)(in_RDI + 0x38) + 0x18);
      puVar1 = *(ulong **)(in_RDI + 0x38);
      puVar4 = (ulong *)(*(long *)(in_RDI + 0x38) + 8);
      auVar5 = vcvtusi2ss_avx512f(auVar5,**(long **)(in_RDI + 0x38) * 100);
      auVar7 = vcvtusi2ss_avx512f(auVar7,*(undefined8 *)(*(long *)(in_RDI + 0x38) + 8));
      auVar6._0_4_ = auVar5._0_4_ / auVar7._0_4_;
      auVar6._4_12_ = auVar5._4_12_;
      local_c54 = auVar6._0_4_;
      tonk::SDKConnection::GetStatusEx((SDKConnection *)in_stack_fffffffffffff200);
      auVar5 = vcvtusi2sd_avx512f(auVar6,local_c70);
      local_c60 = auVar5._0_8_ / 1000.0;
      local_bd0 = &Logger;
      local_bd8 = "File(";
      local_be8 = ") progress: ";
      local_bf8 = " / ";
      local_c08 = " Bytes (";
      local_c10 = &local_c54;
      local_c18 = "%).  Incoming at ";
      local_c20 = &local_c60;
      local_c28 = " KBPS";
      local_b38 = &Logger;
      local_b3c = 2;
      local_b48 = "File(";
      local_b58 = ") progress: ";
      local_b68 = " / ";
      local_b78 = " Bytes (";
      local_b88 = "%).  Incoming at ";
      local_b98 = " KBPS";
      local_b28 = &Logger;
      local_b2c = 2;
      local_c00 = puVar4;
      local_bf0 = puVar1;
      local_be0 = puVar3;
      local_b90 = local_c20;
      local_b80 = local_c10;
      local_b70 = puVar4;
      local_b60 = puVar1;
      local_b50 = puVar3;
      if ((int)Logger.ChannelMinLevel < 3) {
        local_928 = &Logger;
        local_92c = 2;
        local_938 = "File(";
        local_948 = ") progress: ";
        local_958 = " / ";
        local_968 = " Bytes (";
        local_978 = "%).  Incoming at ";
        local_988 = " KBPS";
        local_980 = local_c20;
        local_970 = local_c10;
        local_960 = puVar4;
        local_950 = puVar1;
        local_940 = puVar3;
        logger::LogStringBuffer::LogStringBuffer
                  (in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,Trace);
        local_8c8 = 0x118328;
        local_8b8 = &Logger;
        local_8d0 = local_938;
        local_8d8 = local_940;
        local_8e0 = local_948;
        local_8e8 = local_950;
        local_8f0 = local_958;
        local_8f8 = local_960;
        local_900 = local_968;
        local_908 = local_970;
        local_910 = local_978;
        local_918 = local_980;
        local_920 = local_988;
        local_8a0 = &Logger;
        local_8c0 = local_b10;
        local_8b0 = local_8c8;
        local_8a8 = local_b10;
        local_898 = local_8c8;
        local_890 = local_b10;
        std::operator<<(aoStack_b00,(string *)&Logger.Prefix);
        local_828 = &Logger;
        local_830 = local_8c0;
        local_838 = local_8d0;
        local_840 = local_8d8;
        local_848 = local_8e0;
        local_850 = local_8e8;
        local_858 = local_8f0;
        local_860 = local_8f8;
        local_868 = local_900;
        local_870 = local_908;
        local_878 = local_910;
        local_880 = local_918;
        local_888 = local_920;
        local_810 = &Logger;
        local_818 = local_8c0;
        local_820 = local_8d0;
        local_7a0 = local_8c0;
        local_7a8 = local_8d0;
        std::operator<<((ostream *)(local_8c0 + 0x10),local_8d0);
        local_7b0 = &Logger;
        local_7b8 = local_830;
        local_7c0 = local_840;
        local_7c8 = local_848;
        local_7d0 = local_850;
        local_7d8 = local_858;
        local_7e0 = local_860;
        local_7e8 = local_868;
        local_7f0 = local_870;
        local_7f8 = local_878;
        local_800 = local_880;
        local_808 = local_888;
        local_788 = &Logger;
        local_790 = local_830;
        local_798 = local_840;
        local_720 = local_830;
        local_728 = local_840;
        std::operator<<((ostream *)(local_830 + 0x10),(char *)*local_840);
        local_730 = &Logger;
        local_738 = local_7b8;
        local_740 = local_7c8;
        local_748 = local_7d0;
        local_750 = local_7d8;
        local_758 = local_7e0;
        local_760 = local_7e8;
        local_768 = local_7f0;
        local_770 = local_7f8;
        local_778 = local_800;
        local_780 = local_808;
        local_708 = &Logger;
        local_710 = local_7b8;
        local_718 = local_7c8;
        local_6a8 = local_7b8;
        local_6b0 = local_7c8;
        std::operator<<((ostream *)(local_7b8 + 0x10),local_7c8);
        local_6b8 = &Logger;
        local_6c0 = local_738;
        local_6c8 = local_748;
        local_6d0 = local_750;
        local_6d8 = local_758;
        local_6e0 = local_760;
        local_6e8 = local_768;
        local_6f0 = local_770;
        local_6f8 = local_778;
        local_700 = local_780;
        local_690 = &Logger;
        local_698 = local_738;
        local_6a0 = local_748;
        local_610 = local_738;
        local_618 = local_748;
        std::ostream::operator<<((ostream *)(local_738 + 0x10),*local_748);
        local_648 = &Logger;
        local_650 = local_6c0;
        local_658 = local_6d0;
        local_660 = local_6d8;
        local_668 = local_6e0;
        local_670 = local_6e8;
        local_678 = local_6f0;
        local_680 = local_6f8;
        local_688 = local_700;
        local_630 = &Logger;
        local_638 = local_6c0;
        local_640 = local_6d0;
        local_620 = local_6c0;
        local_628 = local_6d0;
        std::operator<<((ostream *)(local_6c0 + 0x10),local_6d0);
        local_5d0 = &Logger;
        local_5d8 = local_650;
        local_5e0 = local_660;
        local_5e8 = local_668;
        local_5f0 = local_670;
        local_5f8 = local_678;
        local_600 = local_680;
        local_608 = local_688;
        local_5b8 = &Logger;
        local_5c0 = local_650;
        local_5c8 = local_660;
        local_5a8 = local_650;
        local_5b0 = local_660;
        std::ostream::operator<<((ostream *)(local_650 + 0x10),*local_660);
        local_570 = &Logger;
        local_578 = local_5d8;
        local_580 = local_5e8;
        local_588 = local_5f0;
        local_590 = local_5f8;
        local_598 = local_600;
        local_5a0 = local_608;
        local_558 = &Logger;
        local_560 = local_5d8;
        local_568 = local_5e8;
        local_518 = local_5d8;
        local_520 = local_5e8;
        std::operator<<((ostream *)(local_5d8 + 0x10),local_5e8);
        local_528 = &Logger;
        local_530 = local_578;
        local_538 = local_588;
        local_540 = local_590;
        local_548 = local_598;
        local_550 = local_5a0;
        local_500 = &Logger;
        local_508 = local_578;
        local_510 = local_588;
        local_4c8 = local_578;
        local_4d0 = local_588;
        std::ostream::operator<<((ostream *)(local_578 + 0x10),*local_588);
        local_4d8 = &Logger;
        local_4e0 = local_530;
        local_4e8 = local_540;
        local_4f0 = local_548;
        local_4f8 = local_550;
        local_4b0 = &Logger;
        local_4b8 = local_530;
        local_4c0 = local_540;
        local_458 = local_530;
        local_460 = local_540;
        std::operator<<((ostream *)(local_530 + 0x10),local_540);
        local_490 = &Logger;
        local_498 = local_4e0;
        local_4a0 = local_4f0;
        local_4a8 = local_4f8;
        local_440 = &Logger;
        local_448 = local_4e0;
        local_450 = local_4f0;
        local_430 = local_4e0;
        local_438 = local_4f0;
        std::ostream::operator<<((ostream *)(local_4e0 + 0x10),*local_4f0);
        local_478 = &Logger;
        local_480 = local_498;
        local_488 = local_4a8;
        local_468 = local_498;
        local_470 = local_4a8;
        std::operator<<((ostream *)(local_498 + 0x10),local_4a8);
        logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(in_stack_fffffffffffff240,in_stack_fffffffffffff238);
        logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x104b2f);
      }
      local_ce9 = 0x4d;
      tonk::WriteU64_LE(auStack_ce8,local_c50);
      tonk::SDKConnection::Send
                (in_stack_fffffffffffff208,in_stack_fffffffffffff200,
                 (uint64_t)in_stack_fffffffffffff1f8,0);
    }
  }
  else if ((in_ESI == 0x33) && (in_ECX == 0xc)) {
    local_c40 = in_RDX;
    local_cf8 = tonk::ReadU64_LE((uint8_t *)(in_RDX + 1));
    local_d00 = tonk_time();
    local_d04 = tonk::ReadU24_LE((uint8_t *)(local_c40 + 9));
    local_d10 = tonk::SDKConnection::FromLocalTime23
                          ((SDKConnection *)in_stack_fffffffffffff200,
                           (uint32_t)((ulong)in_stack_fffffffffffff1f8 >> 0x20));
    auVar5 = vcvtusi2ss_avx512f(auVar5,local_d00 - local_cf8);
    auVar7._0_4_ = auVar5._0_4_ / 1000.0;
    auVar7._4_12_ = auVar5._4_12_;
    auVar5 = vcvtusi2ss_avx512f(auVar7,local_d00 - local_d10);
    local_d18 = auVar5._0_4_ / 1000.0;
    local_ba0 = &Logger;
    local_ba8 = "Low-latency ping RTT = ";
    local_bb0 = &local_d14;
    local_bb8 = " ms, OWD(remote2local) = ";
    local_bc0 = &local_d18;
    local_bc8 = " ms";
    local_3f8 = &Logger;
    local_3fc = 2;
    local_408 = "Low-latency ping RTT = ";
    local_418 = " ms, OWD(remote2local) = ";
    local_428 = " ms";
    buffer_00 = &Logger;
    local_3e8 = &Logger;
    local_3ec = 2;
    if ((int)Logger.ChannelMinLevel < 3) {
      local_218 = &Logger;
      local_21c = 2;
      local_228 = "Low-latency ping RTT = ";
      local_238 = " ms, OWD(remote2local) = ";
      local_248 = " ms";
      local_d14 = auVar7._0_4_;
      local_420 = local_bc0;
      local_410 = local_bb0;
      local_240 = local_bc0;
      local_230 = local_bb0;
      logger::LogStringBuffer::LogStringBuffer
                (in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,Trace);
      local_1e8 = 0x118328;
      local_1d8 = &Logger;
      local_1f0 = local_228;
      local_1f8 = local_230;
      local_200 = local_238;
      local_208 = local_240;
      local_210 = local_248;
      local_1c0 = &Logger;
      local_1e0 = local_3d0;
      local_1d0 = local_1e8;
      local_1c8 = local_3d0;
      local_1b8 = local_1e8;
      local_1b0 = local_3d0;
      std::operator<<(aoStack_3c0,(string *)&Logger.Prefix);
      local_178 = &Logger;
      local_180 = local_1e0;
      local_188 = local_1f0;
      local_190 = local_1f8;
      local_198 = local_200;
      local_1a0 = local_208;
      local_1a8 = local_210;
      pCVar8 = &Logger;
      local_160 = &Logger;
      local_168 = local_1e0;
      local_170 = local_1f0;
      local_f8 = local_1e0;
      local_100 = local_1f0;
      std::operator<<((ostream *)(local_1e0 + 0x10),local_1f0);
      local_138 = local_180;
      local_140 = local_190;
      local_148 = local_198;
      local_150 = local_1a0;
      local_158 = local_1a8;
      local_120 = local_180;
      local_128 = local_190;
      local_108 = local_180;
      local_110 = local_190;
      local_130 = pCVar8;
      local_118 = pCVar8;
      std::ostream::operator<<((ostream *)(local_180 + 0x10),*local_190);
      local_d8 = local_138;
      local_e0 = local_148;
      local_e8 = local_150;
      local_f0 = local_158;
      local_c0 = local_138;
      local_c8 = local_148;
      local_38 = local_138;
      local_40 = local_148;
      local_d0 = pCVar8;
      local_b8 = pCVar8;
      std::operator<<((ostream *)(local_138 + 0x10),local_148);
      local_a0 = local_d8;
      local_a8 = local_e8;
      local_b0 = local_f0;
      local_60 = local_d8;
      local_68 = local_e8;
      local_48 = local_d8;
      local_50 = local_e8;
      local_98 = pCVar8;
      local_58 = pCVar8;
      std::ostream::operator<<((ostream *)(local_d8 + 0x10),*local_e8);
      local_88 = local_a0;
      local_90 = local_b0;
      local_70 = local_a0;
      local_78 = local_b0;
      local_80 = pCVar8;
      std::operator<<((ostream *)(local_a0 + 0x10),local_b0);
      logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(in_stack_fffffffffffff240,(LogStringBuffer *)buffer_00);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1052bd);
    }
  }
  return;
}

Assistant:

void MyClientConnection::OnData(
    uint32_t          channel,  // Channel number attached to each message by sender
    const uint8_t*       data,  // Pointer to a buffer containing the message data
    uint32_t            bytes   // Number of bytes in the message
)
{
    if (channel == TonkChannel_LowPri0)
    {
        File = tonk_file_receive(
            File,
            data,
            bytes,
            [](TonkFile file, void* context) -> int
        {
            MyClientConnection* thiz = reinterpret_cast<MyClientConnection*>(context);

            return thiz->OnFileDone(file);
        }, this);

        const uint64_t nowUsec = tonk_time();
        if (File && nowUsec - LastReportUsec > 1000000)
        {
            LastReportUsec = nowUsec;
            Logger.Info("File(", File->Name, ") progress: ", File->ProgressBytes, " / ", File->TotalBytes,
                " Bytes (", File->ProgressBytes * 100 / (float)File->TotalBytes,
                "%).  Incoming at ", GetStatusEx().IncomingBPS / 1000.0, " KBPS");

            // Periodically send a ping to demonstrate that data is still low-latency
            uint8_t ping_message[1 + 8];
            ping_message[0] = 77;
            tonk::WriteU64_LE(ping_message + 1, nowUsec);
            Send(ping_message, 9, TonkChannel_Reliable1);
        }
    }
    else if (channel == TonkChannel_Reliable1 && bytes == 1 + 8 + 3)
    {
        uint64_t pingUsec = tonk::ReadU64_LE(data + 1);
        uint64_t pongUsec = tonk_time();

        uint32_t compressedRemoteUsec = tonk::ReadU24_LE(data + 1 + 8);
        uint64_t remoteUsec = FromLocalTime23(compressedRemoteUsec);

        Logger.Info("Low-latency ping RTT = ", (pongUsec - pingUsec) / 1000.f, " ms, OWD(remote2local) = ", (pongUsec - remoteUsec) / 1000.f, " ms");
    }
}